

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void BailOutRecord::ScheduleLoopBodyCodeGen
               (ScriptFunction *function,ScriptFunction *innerMostInlinee,
               BailOutRecord *bailOutRecord,BailOutKind bailOutKind)

{
  undefined1 *puVar1;
  ushort uVar2;
  InterpreterStackFrame *pIVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  LocalFunctionId LVar7;
  uint uVar8;
  int iVar9;
  FunctionBody *this;
  ScriptContext *pSVar10;
  LoopHeader *this_00;
  undefined4 *puVar11;
  LoopEntryPointInfo *pLVar12;
  DynamicProfileInfo *pDVar13;
  FunctionBody *pFVar14;
  undefined4 extraout_var;
  char *pcVar15;
  char *pcVar16;
  undefined4 extraout_var_00;
  char16 *pcVar17;
  undefined4 extraout_var_01;
  RejitReason RVar18;
  RejitReason RVar19;
  wchar local_b8 [4];
  char16 debugStringBuffer [42];
  byte local_31;
  
  this = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,ReJITPhase,uVar6,LVar7);
  if (bVar5) {
    return;
  }
  pSVar10 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  pIVar3 = pSVar10->threadContext->leafInterpreterFrame;
  this_00 = Js::FunctionBody::GetLoopHeader(this,*(uint *)(pIVar3 + 0xcc));
  if (this_00 == (LoopHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x9a4,"(loopHeader != nullptr)","loopHeader != nullptr");
    if (!bVar5) goto LAB_003e78fc;
    *puVar11 = 0;
  }
  bailOutRecord->bailOutCount = bailOutRecord->bailOutCount + 1;
  if (bailOutKind == BailOutInvalid) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x9aa,"(bailOutKind != IR::BailOutInvalid)",
                       "bailOutKind != IR::BailOutInvalid");
    if (!bVar5) goto LAB_003e78fc;
    *puVar11 = 0;
  }
  pLVar12 = Js::LoopHeader::GetCurrentEntryPointInfo(this_00);
  uVar8 = pLVar12->totalJittedLoopIterations + pLVar12->jittedLoopIterationsSinceLastBailout;
  pLVar12->totalJittedLoopIterations = uVar8;
  pLVar12->jittedLoopIterationsSinceLastBailout = 0;
  if (0xfe < uVar8) {
    uVar8 = 0xff;
  }
  local_31 = (byte)uVar8 - ((char)DAT_0144d970 + 1U);
  if ((byte)uVar8 < (byte)((char)DAT_0144d970 + 1U)) {
    local_31 = 0;
  }
  CheckPreemptiveRejit(this,bailOutKind,bailOutRecord,&local_31,*(int *)(pIVar3 + 0xcc));
  pLVar12->totalJittedLoopIterations = (uint)local_31;
  if ((this->dynamicProfileInfo).ptr == (DynamicProfileInfo *)0x0 || local_31 != 0) {
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,ReJITPhase,uVar6,LVar7);
    if (!bVar5) {
      RVar18 = None;
      goto LAB_003e73c8;
    }
  }
  pDVar13 = Js::FunctionBody::GetAnyDynamicProfileInfo(this);
  if ((bailOutKind & (BailOutOnDivSrcConditions|BailOutOnResultConditions)) == BailOutInvalid) {
    RVar19 = None;
    switch(bailOutKind) {
    case BailOutIntOnly:
    case BailOnIntMin:
      goto switchD_003e7355_caseD_1;
    case BailOutNumberOnly:
    case BailOutPrimitiveButString:
      puVar1 = &(pDVar13->bits).field_0x1;
      *puVar1 = *puVar1 | 2;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = FloatTypeSpecDisabled;
      break;
    case BailOutOnImplicitCalls:
    case BailOutOnImplicitCallsPreOp:
      RVar19 = ImplicitCallFlagsChanged;
      break;
    case BailOutOnNotPrimitive:
      *(byte *)&pDVar13->bits = *(byte *)&pDVar13->bits | 0x40;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = LossyIntTypeSpecDisabled;
      break;
    case BailOutOnMemOpError:
      *(byte *)&pDVar13->bits = *(byte *)&pDVar13->bits | 0x80;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = MemOpDisabled;
      break;
    case BailOutOnInlineFunction:
    case BailOutOnPolymorphicInlineFunction:
    case BailOutOnFailedPolymorphicInlineTypeCheck:
      RVar19 = InlineeChanged;
      break;
    case BailOutOnNoProfile:
      this->bailOnMisingProfileCount = '\0';
      RVar19 = NoProfile;
      break;
    case BailOutShared:
    case BailOutInjected:
    case BailOutFailedInlineTypeCheck:
    case BailOnDivResultNotInt:
    case BailOnSimpleJitToFullJitLoopBody:
      break;
    case BailOutOnNotArray:
      puVar1 = &(pDVar13->bits).field_0x1;
      *puVar1 = *puVar1 | 0x10;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = ArrayCheckHoistDisabled;
      break;
    case BailOutOnNotNativeArray:
      RVar19 = ExpectingNativeArray;
      if (0x31 < this_00->rejitCount) {
        RVar19 = None;
      }
      break;
    case BailOutConventionalTypedArrayAccessOnly:
      puVar1 = &(pDVar13->bits).field_0x2;
      *puVar1 = *puVar1 | 0x10;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = TypedArrayTypeSpecDisabled;
      break;
    case BailOutOnIrregularLength:
      puVar1 = &(pDVar13->bits).field_0x2;
      *puVar1 = *puVar1 | 0x20;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = LdLenIntSpecDisabled;
      break;
    case BailOutCheckThis:
      puVar1 = &(pDVar13->bits).field_0x1;
      *puVar1 = *puVar1 | 4;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = CheckThisDisabled;
      break;
    case BailOutOnTaggedValue:
      puVar1 = &(pDVar13->bits).field_0x4;
      *puVar1 = *puVar1 | 0x10;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = FailedTagCheck;
      break;
    case BailOutFailedTypeCheck:
      uVar6 = Js::FunctionBody::GetByteCodeInLoopCount(this);
      RVar19 = FailedTypeCheck;
      if (DAT_01441dd0 < uVar6) {
        puVar1 = &(pDVar13->bits).field_0x4;
        *puVar1 = *puVar1 | 1;
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,DisabledObjTypeSpecPhase);
        if (bVar5) {
          uVar6 = Js::FunctionBody::GetLoopNumber(this,this_00);
          iVar9 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
          Output::Print(L"Disabled obj type spec in jit loop body for loop %d in %s (%d)\n",
                        (ulong)uVar6,CONCAT44(extraout_var_01,iVar9),
                        (ulong)(this->super_ParseableFunctionInfo).super_FunctionProxy.
                               m_functionNumber);
          Output::Flush();
        }
      }
      break;
    case BailOutFailedEquivalentTypeCheck:
    case BailOutFailedEquivalentFixedFieldTypeCheck:
      RVar19 = FailedEquivalentFixedFieldTypeCheck -
               (bailOutKind == BailOutFailedEquivalentTypeCheck);
      break;
    case BailOutExpectingInteger:
      puVar1 = &(pDVar13->bits).field_0x3;
      *puVar1 = *puVar1 | 0x40;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = DisableSwitchOptExpectingInteger;
      break;
    case BailOutExpectingString:
      puVar1 = &(pDVar13->bits).field_0x3;
      *puVar1 = *puVar1 | 0x40;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = DisableSwitchOptExpectingString;
      break;
    case BailOutFailedFixedFieldTypeCheck:
      RVar19 = FailedFixedFieldTypeCheck;
      break;
    case BailOutFailedFixedFieldCheck:
      RVar19 = FailedFixedFieldCheck;
      break;
    case BailOutOnFloor:
      puVar1 = &(pDVar13->bits).field_0x3;
      *puVar1 = *puVar1 | 0x10;
      RVar19 = FloorInliningDisabled;
      break;
    case BailOnModByPowerOf2:
      RVar19 = ModByPowerOf2;
      break;
    case BailOutFailedCtorGuardCheck:
      RVar19 = CtorGuardInvalidated;
      break;
    case BailOutOnFailedHoistedBoundCheck:
      puVar1 = &(pDVar13->bits).field_0x2;
      *puVar1 = *puVar1 | 0x80;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = BoundCheckHoistDisabled;
      break;
    case BailOutOnFailedHoistedLoopCountBasedBoundCheck:
      puVar1 = &(pDVar13->bits).field_0x3;
      *puVar1 = *puVar1 | 2;
      this->field_0x179 = this->field_0x179 | 8;
      RVar19 = LoopCountBasedBoundCheckHoistDisabled;
      break;
    default:
      if (bailOutKind == BailOutOnPowIntIntOverflow) {
        puVar1 = &(pDVar13->bits).field_0x4;
        *puVar1 = *puVar1 | 2;
        this->field_0x179 = this->field_0x179 | 8;
        RVar19 = PowIntIntTypeSpecDisabled;
      }
      else if (bailOutKind == BailOutOnMissingValue) {
        puVar1 = &(pDVar13->bits).field_0x1;
        *puVar1 = *puVar1 | 0x40;
        RVar19 = ArrayMissingValueCheckHoistDisabled;
      }
      else if (bailOutKind == BailOutConventionalNativeArrayAccessOnly) {
        RVar19 = ExpectingConventionalNativeArrayAccess;
      }
      else if (bailOutKind == BailOutConvertedNativeArray) {
        RVar19 = ConvertedNativeArray;
      }
      else if (bailOutKind == BailOutOnArrayAccessHelperCall) {
        RVar19 = ArrayAccessNeededHelperCall;
      }
      else if (bailOutKind == BailOutOnInvalidatedArrayHeadSegment) {
        puVar1 = &(pDVar13->bits).field_0x2;
        *puVar1 = *puVar1 | 1;
        this->field_0x179 = this->field_0x179 | 8;
        RVar19 = JsArraySegmentHoistDisabled;
      }
      else if (bailOutKind == BailOnStackArgsOutOfActualsRange) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x9f6,"(false)",
                           "How did we reach here ? Stack args opt is currently disabled in loop body gen."
                          );
        if (!bVar5) {
LAB_003e78fc:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar11 = 0;
        RVar19 = None;
      }
    }
  }
  else {
switchD_003e7355_caseD_1:
    if ((bailOutKind >> 0xb & 1) == 0) {
      if (bailOutKind == BailOnDivResultNotInt ||
          (bailOutKind & BailOutOnDivSrcConditions) != BailOutInvalid) {
        *(uint *)&pDVar13->bits = *(uint *)&pDVar13->bits | 0x20;
        RVar19 = DivIntTypeSpecDisabled;
      }
      else {
        *(uint *)&pDVar13->bits = *(uint *)&pDVar13->bits | 2;
        RVar19 = AggressiveIntTypeSpecDisabled;
      }
    }
    else {
      *(byte *)&pDVar13->bits = *(byte *)&pDVar13->bits | 8;
      RVar19 = AggressiveMulIntTypeSpecDisabled;
    }
    this->field_0x179 = this->field_0x179 | 8;
  }
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,ReJITPhase,uVar6,LVar7);
  RVar18 = RVar19;
  if (bVar5) {
    RVar18 = Forced;
  }
  if (RVar19 != None) {
    RVar18 = RVar19;
  }
LAB_003e73c8:
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,ReJITPhase,uVar6,LVar7);
  RVar19 = Forced;
  if (RVar18 != None) {
    RVar19 = RVar18;
  }
  if (!bVar5) {
    RVar19 = RVar18;
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,ReJITPhase);
  if ((bVar5) &&
     ((DAT_0145c3e0 == DAT_0145c3e8 ||
      (bVar5 = Js::NumberSet::Contains((NumberSet *)&DAT_0145c3c0,bailOutKind), bVar5)))) {
    pFVar14 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
    iVar9 = (*(pFVar14->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar14);
    uVar6 = Js::FunctionBody::GetLoopNumber(this,this_00);
    pcVar15 = GetBailOutKindName(bailOutKind);
    pcVar16 = GetRejitReasonName(RVar19);
    Output::Print(L"Bailout from loop: function: %s, loopNumber: %d, bailOutKindName: (%S), reJitReason: %S\r\n"
                  ,CONCAT44(extraout_var,iVar9),(ulong)uVar6,pcVar15,pcVar16);
    Output::Flush();
  }
  pSVar10 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
  Js::ScriptContext::LogBailout(pSVar10,this,bailOutKind);
  if (RVar19 != None) {
    pSVar10 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this);
    Js::ScriptContext::LogRejit(pSVar10,this,RVar19);
    uVar6 = Js::FunctionBody::GetLoopInterpretCount(this,this_00);
    this_00->interpretCount = uVar6 - 2;
    Js::LoopHeader::CreateEntryPoint(this_00);
    this_00->rejitCount = this_00->rejitCount + 1;
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this);
    LVar7 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,ReJITPhase,uVar6,LVar7);
    if (bVar5) {
      iVar9 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
      pcVar17 = Js::FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_b8)
      ;
      uVar6 = Js::FunctionBody::GetLoopNumber(this,this_00);
      uVar2 = bailOutRecord->bailOutCount;
      pcVar15 = GetRejitReasonName(RVar19);
      Output::Print(L"Rejit(loop): function: %s (%s) loop: %u bailOutCount: %hu reason: %S",
                    CONCAT44(extraout_var_00,iVar9),pcVar17,(ulong)uVar6,(ulong)uVar2,pcVar15);
      if (bailOutKind != BailOutInvalid) {
        pcVar15 = GetBailOutKindName(bailOutKind);
        Output::Print(L" (%S)",pcVar15);
      }
      Output::Print(L"\n");
      Output::Flush();
    }
  }
  return;
}

Assistant:

void BailOutRecord::ScheduleLoopBodyCodeGen(Js::ScriptFunction * function, Js::ScriptFunction * innerMostInlinee, BailOutRecord const * bailOutRecord, IR::BailOutKind bailOutKind)
{
    Assert(bailOutKind != IR::LazyBailOut);
    Js::FunctionBody * executeFunction = function->GetFunctionBody();

    if (PHASE_OFF(Js::ReJITPhase, executeFunction))
    {
        return;
    }

    Js::LoopHeader * loopHeader = nullptr;

    Js::InterpreterStackFrame * interpreterFrame = executeFunction->GetScriptContext()->GetThreadContext()->GetLeafInterpreterFrame();

    loopHeader = executeFunction->GetLoopHeader(interpreterFrame->GetCurrentLoopNum());

    Assert(loopHeader != nullptr);

    BailOutRecord * bailOutRecordNotConst = (BailOutRecord *)(void *)bailOutRecord;
    bailOutRecordNotConst->bailOutCount++;

    RejitReason rejitReason = RejitReason::None;
    Assert(bailOutKind != IR::BailOutInvalid);

    Js::LoopEntryPointInfo* entryPointInfo = loopHeader->GetCurrentEntryPointInfo();

    entryPointInfo->totalJittedLoopIterations += entryPointInfo->jittedLoopIterationsSinceLastBailout;
    entryPointInfo->jittedLoopIterationsSinceLastBailout = 0;
    uint8 totalJittedLoopIterations = entryPointInfo->totalJittedLoopIterations > 255 ? 255 : static_cast<uint8>(entryPointInfo->totalJittedLoopIterations);
    totalJittedLoopIterations = totalJittedLoopIterations <= Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout() ? 0 : totalJittedLoopIterations - Js::LoopEntryPointInfo::GetDecrLoopCountPerBailout();

    CheckPreemptiveRejit(executeFunction, bailOutKind, bailOutRecordNotConst, totalJittedLoopIterations, interpreterFrame->GetCurrentLoopNum());

    entryPointInfo->totalJittedLoopIterations = totalJittedLoopIterations;

    if ((executeFunction->HasDynamicProfileInfo() && totalJittedLoopIterations == 0) ||
        PHASE_FORCE(Js::ReJITPhase, executeFunction))
    {
        Js::DynamicProfileInfo * profileInfo = executeFunction->GetAnyDynamicProfileInfo();

        if ((bailOutKind & (IR::BailOutOnResultConditions | IR::BailOutOnDivSrcConditions)) || bailOutKind == IR::BailOutIntOnly || bailOutKind == IR::BailOnIntMin)
        {
            if (bailOutKind & IR::BailOutOnMulOverflow)
            {
                profileInfo->DisableAggressiveMulIntTypeSpec(true);
                rejitReason = RejitReason::AggressiveMulIntTypeSpecDisabled;
            }
            else if ((bailOutKind & (IR::BailOutOnDivByZero | IR::BailOutOnDivOfMinInt)) || bailOutKind == IR::BailOnDivResultNotInt)
            {
                profileInfo->DisableDivIntTypeSpec(true);
                rejitReason = RejitReason::DivIntTypeSpecDisabled;
            }
            else
            {
                profileInfo->DisableAggressiveIntTypeSpec(true);
                rejitReason = RejitReason::AggressiveIntTypeSpecDisabled;
            }
            executeFunction->SetDontRethunkAfterBailout();
        }
        else switch(bailOutKind)
        {
            case IR::BailOutOnNotPrimitive:
                profileInfo->DisableLossyIntTypeSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::LossyIntTypeSpecDisabled;
                break;

            case IR::BailOutOnMemOpError:
                profileInfo->DisableMemOp();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::MemOpDisabled;
                break;

            case IR::BailOutPrimitiveButString:
            case IR::BailOutNumberOnly:
                profileInfo->DisableFloatTypeSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::FloatTypeSpecDisabled;
                break;

            case IR::BailOutOnImplicitCalls:
            case IR::BailOutOnImplicitCallsPreOp:
                rejitReason = RejitReason::ImplicitCallFlagsChanged;
                break;

            case IR::BailOutExpectingInteger:
                profileInfo->DisableSwitchOpt();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::DisableSwitchOptExpectingInteger;
                break;

            case IR::BailOutExpectingString:
                profileInfo->DisableSwitchOpt();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::DisableSwitchOptExpectingString;
                break;

            case IR::BailOnStackArgsOutOfActualsRange:
                AssertMsg(false, "How did we reach here ? Stack args opt is currently disabled in loop body gen.");
                break;

            case IR::BailOnModByPowerOf2:
                rejitReason = RejitReason::ModByPowerOf2;
                break;

            case IR::BailOutOnNotArray:
                profileInfo->DisableArrayCheckHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::ArrayCheckHoistDisabled;
                break;

            case IR::BailOutOnNotNativeArray:
                // REVIEW: We have an issue with array profile info.  The info on the type of array we have won't
                //         get fixed by rejitting.  For now, just give up after 50 rejits.
                if (loopHeader->GetRejitCount() >= 50)
                {
                    rejitReason = RejitReason::None;
                }
                else
                {
                    rejitReason = RejitReason::ExpectingNativeArray;
                }
                break;

            case IR::BailOutConvertedNativeArray:
                rejitReason = RejitReason::ConvertedNativeArray;
                break;

            case IR::BailOutConventionalTypedArrayAccessOnly:
                profileInfo->DisableTypedArrayTypeSpec(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::TypedArrayTypeSpecDisabled;
                break;

            case IR::BailOutConventionalNativeArrayAccessOnly:
                rejitReason = RejitReason::ExpectingConventionalNativeArrayAccess;
                break;

            case IR::BailOutOnMissingValue:
                profileInfo->DisableArrayMissingValueCheckHoist(true);
                rejitReason = RejitReason::ArrayMissingValueCheckHoistDisabled;
                break;

            case IR::BailOutOnArrayAccessHelperCall:
                // This is a pre-op bailout, so the interpreter will update the profile data for this byte-code instruction to
                // prevent excessive bailouts here in the future
                rejitReason = RejitReason::ArrayAccessNeededHelperCall;
                break;

            case IR::BailOutOnInvalidatedArrayHeadSegment:
                profileInfo->DisableJsArraySegmentHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::JsArraySegmentHoistDisabled;
                break;

            case IR::BailOutOnIrregularLength:
                profileInfo->DisableLdLenIntSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::LdLenIntSpecDisabled;
                break;

            case IR::BailOutOnFailedHoistedBoundCheck:
                profileInfo->DisableBoundCheckHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::BoundCheckHoistDisabled;
                break;

            case IR::BailOutOnFailedHoistedLoopCountBasedBoundCheck:
                profileInfo->DisableLoopCountBasedBoundCheckHoist(true);
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::LoopCountBasedBoundCheckHoistDisabled;
                break;

            case IR::BailOutOnInlineFunction:
            case IR::BailOutOnPolymorphicInlineFunction:
            case IR::BailOutOnFailedPolymorphicInlineTypeCheck:
                rejitReason = RejitReason::InlineeChanged;
                break;

            case IR::BailOutOnNoProfile:
                rejitReason = RejitReason::NoProfile;
                executeFunction->ResetBailOnMisingProfileCount();
                break;

            case IR::BailOutCheckThis:
                profileInfo->DisableCheckThis();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::CheckThisDisabled;
                break;

            case IR::BailOutFailedTypeCheck:
                // An inline cache must have gone from monomorphic to polymorphic.
                // This is already noted in the profile data, so optimization of the given ld/st will
                // be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.

                // Disable ObjTypeSpec in a large loop body after the first rejit itself.
                // Rejitting a large loop body takes more time and the fact that loop bodies are prioritized ahead of functions to be jitted only augments the problem.
                if(executeFunction->GetByteCodeInLoopCount() > (uint)CONFIG_FLAG(LoopBodySizeThresholdToDisableOpts))
                {
                    profileInfo->DisableObjTypeSpecInJitLoopBody();
                    if(PHASE_TRACE1(Js::DisabledObjTypeSpecPhase))
                    {
                        Output::Print(_u("Disabled obj type spec in jit loop body for loop %d in %s (%d)\n"),
                            executeFunction->GetLoopNumber(loopHeader), executeFunction->GetDisplayName(), executeFunction->GetFunctionNumber());
                        Output::Flush();
                    }
                }

                rejitReason = RejitReason::FailedTypeCheck;
                break;

            case IR::BailOutFailedFixedFieldTypeCheck:
                // An inline cache must have gone from monomorphic to polymorphic or some fixed field
                // became non-fixed.  Either one is already noted in the profile data and type system,
                // so optimization of the given instruction will be inhibited on re-jit.
                // Consider disabling the optimization across the function after n failed type checks.
                rejitReason = RejitReason::FailedFixedFieldTypeCheck;
                break;

            case IR::BailOutFailedEquivalentTypeCheck:
            case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
                rejitReason = bailOutKind == IR::BailOutFailedEquivalentTypeCheck ?
                    RejitReason::FailedEquivalentTypeCheck : RejitReason::FailedEquivalentFixedFieldTypeCheck;
                break;

            case IR::BailOutFailedCtorGuardCheck:
                // (ObjTypeSpec): Consider scheduling re-JIT right after the first bailout.  We will never successfully execute the
                // function from which we just bailed out, unless we take a different code path through it.

                // A constructor cache guard may be invalidated for one of two reasons:
                // a) the constructor's prototype property has changed, or
                // b) one of the properties protected by the guard (this constructor cache served as) has changed in some way (e.g. became
                // read-only).
                // In the former case, the cache itself will be marked as polymorphic and on re-JIT we won't do the optimization.
                // In the latter case, the inline cache for the offending property will be cleared and on re-JIT the guard will not be enlisted
                // to protect that property operation.
                rejitReason = RejitReason::CtorGuardInvalidated;
                break;

            case IR::BailOutOnFloor:
            {
                profileInfo->DisableFloorInlining();
                rejitReason = RejitReason::FloorInliningDisabled;
                break;
            }

            case IR::BailOutFailedFixedFieldCheck:
                rejitReason = RejitReason::FailedFixedFieldCheck;
                break;

            case IR::BailOutOnTaggedValue:
                profileInfo->DisableTagCheck();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::FailedTagCheck;
                break;

            case IR::BailOutOnPowIntIntOverflow:
                profileInfo->DisablePowIntIntTypeSpec();
                executeFunction->SetDontRethunkAfterBailout();
                rejitReason = RejitReason::PowIntIntTypeSpecDisabled;
                break;
        }

        if(PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
        {
            rejitReason = RejitReason::Forced;
        }
    }

    if (PHASE_FORCE(Js::ReJITPhase, executeFunction) && rejitReason == RejitReason::None)
    {
        rejitReason = RejitReason::Forced;
    }

    REJIT_KIND_TESTTRACE(bailOutKind, _u("Bailout from loop: function: %s, loopNumber: %d, bailOutKindName: (%S), reJitReason: %S\r\n"),
        function->GetFunctionBody()->GetDisplayName(), executeFunction->GetLoopNumber(loopHeader),
        ::GetBailOutKindName(bailOutKind), GetRejitReasonName(rejitReason));

    JS_ETW(EventWriteJSCRIPT_BACKEND_BAILOUT_FROM_LOOP_BODY(
        function->GetFunctionBody()->GetLocalFunctionId(), function->GetFunctionBody()->GetSourceContextId(),
        function->GetFunctionBody()->GetDisplayName(), executeFunction->GetLoopNumber(loopHeader),
        bailOutKind, GetRejitReasonName(rejitReason)));

#ifdef REJIT_STATS
    executeFunction->GetScriptContext()->LogBailout(executeFunction, bailOutKind);
#endif

    if (rejitReason != RejitReason::None)
    {
#ifdef REJIT_STATS
        executeFunction->GetScriptContext()->LogRejit(executeFunction, rejitReason);
#endif
        // Single bailout triggers re-JIT of loop body. the actual codegen scheduling of the new
        // loop body happens in the interpreter
        loopHeader->interpretCount = executeFunction->GetLoopInterpretCount(loopHeader) - 2;
        loopHeader->CreateEntryPoint();
        loopHeader->IncRejitCount();

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if(PHASE_TRACE(Js::ReJITPhase, executeFunction))
        {
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
            Output::Print(
                _u("Rejit(loop): function: %s (%s) loop: %u bailOutCount: %hu reason: %S"),
                executeFunction->GetDisplayName(),
                executeFunction->GetDebugNumberSet(debugStringBuffer),
                executeFunction->GetLoopNumber(loopHeader),
                bailOutRecord->bailOutCount,
                GetRejitReasonName(rejitReason));
            if(bailOutKind != IR::BailOutInvalid)
            {
                Output::Print(_u(" (%S)"), ::GetBailOutKindName(bailOutKind));
            }
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }
}